

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00e1.cpp
# Opt level: O0

int main(void)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  istream *piVar3;
  ostream *poVar4;
  int local_18;
  int local_14;
  int d;
  int m;
  int h;
  
  m = 0;
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&d);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_14);
  std::istream::operator>>(piVar3,&local_18);
  local_14 = local_18 + local_14;
  if (0x3b < local_14) {
    d = local_14 / 0x3c + d;
    local_14 = local_14 % 0x3c;
  }
  d = d % 0x18;
  _Var2 = std::setw(2);
  poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,d);
  poVar4 = std::operator<<(poVar4," ");
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
  std::operator<<(poVar4,"\n");
  return m;
}

Assistant:

int main() {
    int h, m, d;
    cin >> h >> m >> d;
    m += d;
    if (m >= 60) {
        h += (m / 60);
        m %= 60;
    }
    h %= 24;
    cout << setw(2) << setfill('0') << h << " " << setw(2) << setfill('0') << m
         << "\n";
}